

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

void __thiscall
MutableS2ShapeIndex::GetUpdateBatches
          (MutableS2ShapeIndex *this,
          vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
          *batches)

{
  pointer *ppBVar1;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar2;
  pointer pRVar3;
  __uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_> _Var4;
  iterator iVar5;
  pointer pBVar6;
  BatchDescriptor BVar7;
  BatchDescriptor BVar8;
  int iVar9;
  RemovedShape *pending_removal;
  pointer pRVar10;
  ulong uVar11;
  pointer puVar12;
  int iVar13;
  ulong uVar14;
  LogSeverity LVar15;
  int iVar16;
  undefined1 auVar17 [16];
  vector<int,_std::allocator<int>_> batch_sizes;
  S2LogMessage local_58;
  vector<int,_std::allocator<int>_> local_48;
  
  pvVar2 = (this->pending_removals_)._M_t.
           super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           .
           super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
           ._M_head_impl;
  iVar13 = 0;
  iVar16 = 0;
  if (pvVar2 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                 *)0x0) {
    pRVar10 = *(pointer *)
               &(pvVar2->
                super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                )._M_impl;
    pRVar3 = *(pointer *)
              ((long)&(pvVar2->
                      super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                      )._M_impl + 8);
    if (pRVar10 != pRVar3) {
      iVar16 = 0;
      do {
        iVar16 = iVar16 + (int)((ulong)((long)*(pointer *)
                                               ((long)&(pRVar10->edges).
                                                                                                              
                                                  super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>
                                               + 8) -
                                       *(long *)&(pRVar10->edges).
                                                 super__Vector_base<S2Shape::Edge,_std::allocator<S2Shape::Edge>_>
                                                 ._M_impl) >> 4) * -0x55555555;
        pRVar10 = pRVar10 + 1;
      } while (pRVar10 != pRVar3);
    }
  }
  uVar14 = (ulong)this->pending_additions_begin_;
  puVar12 = (this->shapes_).
            super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)(this->shapes_).
                 super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3;
  if (uVar14 < uVar11) {
    iVar13 = 0;
    do {
      _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
      super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
           puVar12[uVar14]._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t;
      if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
          _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
          super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
        iVar9 = (**(code **)(*(long *)_Var4._M_t.
                                      super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                      .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x10))
                          ();
        iVar13 = iVar13 + iVar9;
      }
      uVar14 = uVar14 + 1;
      puVar12 = (this->shapes_).
                super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(this->shapes_).
                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3;
    } while (uVar14 < uVar11);
  }
  iVar13 = iVar13 + iVar16;
  uVar14 = (long)FLAGS_s2shape_index_tmp_memory_budget_mb * 0x100000;
  if ((ulong)((long)iVar13 * 200) < uVar14 ||
      (long)iVar13 * 200 + (long)FLAGS_s2shape_index_tmp_memory_budget_mb * -0x100000 == 0) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _4_4_ = iVar13;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = (int)uVar11;
    iVar5._M_current =
         (batches->
         super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (batches->
        super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
      ::_M_realloc_insert<MutableS2ShapeIndex::BatchDescriptor>
                (batches,iVar5,(BatchDescriptor *)&local_48);
    }
    else {
      *iVar5._M_current =
           (BatchDescriptor)
           local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      ppBVar1 = &(batches->
                 super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
  }
  else {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    auVar17._8_4_ = (int)(uVar14 >> 0x20);
    auVar17._0_8_ = uVar14;
    auVar17._12_4_ = 0x45300000;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    GetBatchSizes(iVar13,100,8.0,200.0,
                  (auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0),&local_48);
    iVar13 = 0;
    if (((this->pending_removals_)._M_t.
         super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
         .
         super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
         ._M_head_impl !=
         (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
          *)0x0) &&
       (iVar13 = iVar16,
       *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start <= iVar16)) {
      local_58.severity_ = this->pending_additions_begin_;
      iVar5._M_current =
           (batches->
           super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_58._4_4_ = iVar16;
      if (iVar5._M_current ==
          (batches->
          super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
        ::_M_realloc_insert<MutableS2ShapeIndex::BatchDescriptor>
                  (batches,iVar5,(BatchDescriptor *)&local_58);
        iVar13 = 0;
      }
      else {
        BVar7.num_edges = iVar16;
        BVar7.additions_end = local_58.severity_;
        *iVar5._M_current = BVar7;
        ppBVar1 = &(batches->
                   super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
        iVar13 = 0;
      }
    }
    LVar15 = this->pending_additions_begin_;
    uVar14 = (ulong)(int)LVar15;
    puVar12 = (this->shapes_).
              super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = (long)(this->shapes_).
                   super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3;
    if (uVar14 < uVar11) {
      do {
        LVar15 = LVar15 + kWarning;
        _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
        super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
             puVar12[uVar14]._M_t.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t
        ;
        if ((_Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>)
            _Var4._M_t.super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
            super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl != (S2Shape *)0x0) {
          iVar16 = (**(code **)(*(long *)_Var4._M_t.
                                         super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>
                                         .super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl +
                               0x10))();
          iVar13 = iVar13 + iVar16;
          iVar5._M_current =
               (batches->
               super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (*(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start +
                      ((long)iVar5._M_current -
                       (long)(batches->
                             super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 1)) <= iVar13) {
            local_58.severity_ = LVar15;
            local_58._4_4_ = iVar13;
            if (iVar5._M_current ==
                (batches->
                super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
              ::_M_realloc_insert<MutableS2ShapeIndex::BatchDescriptor>
                        (batches,iVar5,(BatchDescriptor *)&local_58);
            }
            else {
              BVar8.num_edges = iVar13;
              BVar8.additions_end = LVar15;
              *iVar5._M_current = BVar8;
              ppBVar1 = &(batches->
                         super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppBVar1 = *ppBVar1 + 1;
            }
            iVar13 = 0;
          }
        }
        uVar14 = uVar14 + 1;
        puVar12 = (this->shapes_).
                  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (long)(this->shapes_).
                       super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3;
      } while (uVar14 < uVar11);
    }
    pBVar6 = (batches->
             super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pBVar6[-1].additions_end = (int)uVar11;
    if (800 < (ulong)((long)pBVar6 -
                     (long)(batches->
                           super__Vector_base<MutableS2ShapeIndex::BatchDescriptor,_std::allocator<MutableS2ShapeIndex::BatchDescriptor>_>
                           )._M_impl.super__Vector_impl_data._M_start)) {
      S2LogMessage::S2LogMessage
                (&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
                 ,0x298,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_58.stream_,"Check failed: (batches->size()) <= (kMaxUpdateBatches) ",0x37);
      abort();
    }
    if ((BatchDescriptor)
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (BatchDescriptor)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void MutableS2ShapeIndex::GetUpdateBatches(vector<BatchDescriptor>* batches)
    const {
  // Count the edges being removed and added.
  int num_edges_removed = 0;
  if (pending_removals_) {
    for (const auto& pending_removal : *pending_removals_) {
      num_edges_removed += pending_removal.edges.size();
    }
  }
  int num_edges_added = 0;
  for (int id = pending_additions_begin_; id < shapes_.size(); ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    num_edges_added += shape->num_edges();
  }
  int num_edges = num_edges_removed + num_edges_added;

  // The following memory estimates are based on heap profiling.
  //
  // The final size of a MutableS2ShapeIndex depends mainly on how finely the
  // index is subdivided, as controlled by Options::max_edges_per_cell() and
  // --s2shape_index_default_max_edges_per_cell. For realistic values of
  // max_edges_per_cell() and shapes with moderate numbers of edges, it is
  // difficult to get much below 8 bytes per edge.  [The minimum possible size
  // is 4 bytes per edge (to store a 32-bit edge id in an S2ClippedShape) plus
  // 24 bytes per shape (for the S2ClippedShape itself plus a pointer in the
  // shapes_ vector.]
  //
  // The temporary memory consists mainly of the FaceEdge and ClippedEdge
  // structures plus a ClippedEdge pointer for every level of recursive
  // subdivision.  For very large indexes this can be 200 bytes per edge.
  const size_t kFinalBytesPerEdge = 8;
  const size_t kTmpBytesPerEdge = 200;
  const size_t kTmpMemoryBudgetBytes =
      static_cast<size_t>(FLAGS_s2shape_index_tmp_memory_budget_mb) << 20;

  // We arbitrarily limit the number of batches just as a safety measure.
  // With the current default memory budget of 100 MB, this limit is not
  // reached even when building an index of 350 million edges.
  const int kMaxUpdateBatches = 100;

  if (num_edges * kTmpBytesPerEdge <= kTmpMemoryBudgetBytes) {
    // We can update all edges at once without exceeding kTmpMemoryBudgetBytes.
    batches->push_back(BatchDescriptor(shapes_.size(), num_edges));
    return;
  }
  // Otherwise, break the updates into up to several batches, where the size
  // of each batch is chosen so that all batches use approximately the same
  // high-water memory.  GetBatchSizes() returns the recommended number of
  // edges in each batch.
  vector<int> batch_sizes;
  GetBatchSizes(num_edges, kMaxUpdateBatches, kFinalBytesPerEdge,
                kTmpBytesPerEdge, kTmpMemoryBudgetBytes, &batch_sizes);

  // We always process removed edges in a single batch, since (1) they already
  // take up a lot of memory because we have copied all their edges, and (2)
  // AbsorbIndexCell() uses (shapes_[id] == nullptr) to detect when a shape is
  // being removed, so in order to split the removals into batches we would
  // need a different approach (e.g., temporarily add fake entries to shapes_
  // and restore them back to nullptr as shapes are actually removed).
  num_edges = 0;
  if (pending_removals_) {
    num_edges += num_edges_removed;
    if (num_edges >= batch_sizes[0]) {
      batches->push_back(BatchDescriptor(pending_additions_begin_, num_edges));
      num_edges = 0;
    }
  }
  // Keep adding shapes to each batch until the recommended number of edges
  // for that batch is reached, then move on to the next batch.
  for (int id = pending_additions_begin_; id < shapes_.size(); ++id) {
    const S2Shape* shape = this->shape(id);
    if (shape == nullptr) continue;
    num_edges += shape->num_edges();
    if (num_edges >= batch_sizes[batches->size()]) {
      batches->push_back(BatchDescriptor(id + 1, num_edges));
      num_edges = 0;
    }
  }
  // Some shapes have no edges.  If a shape with no edges is the last shape to
  // be added or removed, then the final batch may not include it, so we fix
  // that problem here.
  batches->back().additions_end = shapes_.size();
  S2_DCHECK_LE(batches->size(), kMaxUpdateBatches);
}